

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O2

SyntaxNode * __thiscall
slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::operator[]
          (SeparatedSyntaxList<slang::syntax::SyntaxNode> *this,size_t index)

{
  reference this_00;
  SyntaxNode *pSVar1;
  
  this_00 = nonstd::span_lite::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::
            operator[](&this->elements,index * 2);
  pSVar1 = TokenOrSyntax::node(this_00);
  return pSVar1;
}

Assistant:

const T* operator[](size_t index) const {
        index <<= 1;
        return &elements[index].node()->template as<T>();
    }